

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

FuncNode * __thiscall asmjit::v1_14::BaseCompiler::addFunc(BaseCompiler *this,FuncNode *func)

{
  BaseNode *pBVar1;
  
  this->_func = func;
  BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func);
  pBVar1 = (this->super_BaseBuilder)._cursor;
  BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func->_exitNode);
  BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func->_end);
  (this->super_BaseBuilder)._cursor = pBVar1;
  return func;
}

Assistant:

FuncNode* BaseCompiler::addFunc(FuncNode* func) {
  _func = func;

  addNode(func);                 // Function node.
  BaseNode* prev = cursor();     // {CURSOR}.
  addNode(func->exitNode());     // Function exit label.
  addNode(func->endNode());      // Function end sentinel.

  _setCursor(prev);
  return func;
}